

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcursor.cpp
# Opt level: O0

void __thiscall QCursor::setShape(QCursor *this,CursorShape shape)

{
  long lVar1;
  void *pvVar2;
  bool bVar3;
  uint in_ESI;
  QCursorData *in_RDI;
  QCursorData *c;
  QCursorData *local_28;
  QCursorData *local_18;
  
  QCursorData::initialize();
  if (in_ESI < 0x16) {
    local_28 = qt_cursorTable[in_ESI];
  }
  else {
    local_28 = (QCursorData *)0x0;
  }
  local_18 = local_28;
  if (local_28 == (QCursorData *)0x0) {
    local_18 = qt_cursorTable[0];
  }
  QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x341720);
  lVar1._0_4_ = in_RDI->ref;
  lVar1._4_4_ = in_RDI->cshape;
  if (lVar1 == 0) {
    *(QCursorData **)in_RDI = local_18;
  }
  else {
    bVar3 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x341747);
    if ((!bVar3) && (pvVar2 = *(void **)in_RDI, pvVar2 != (void *)0x0)) {
      QCursorData::~QCursorData(in_RDI);
      operator_delete(pvVar2,0x38);
    }
    *(QCursorData **)in_RDI = local_18;
  }
  return;
}

Assistant:

void QCursor::setShape(Qt::CursorShape shape)
{
    QCursorData::initialize();
    QCursorData *c = uint(shape) <= Qt::LastCursor ? qt_cursorTable[shape] : nullptr;
    if (!c)
        c = qt_cursorTable[0];
    c->ref.ref();
    if (!d) {
        d = c;
    } else {
        if (!d->ref.deref())
            delete d;
        d = c;
    }
}